

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

double __thiscall booster::log::sinks::syslog::log(syslog *this,double __x)

{
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  uint __pri;
  int *in_RSI;
  char *__s;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  undefined1 *local_48;
  undefined1 local_38 [16];
  
  iVar1 = *in_RSI;
  __pri = 0;
  if (((((9 < iVar1) && (__pri = 1, 0x13 < iVar1)) && (__pri = 2, 0x1d < iVar1)) &&
      ((__pri = 3, 0x27 < iVar1 && (__pri = 4, 0x31 < iVar1)))) && (__pri = 5, 0x3b < iVar1)) {
    __pri = iVar1 < 0x46 ^ 7;
  }
  uVar2 = *(undefined8 *)(in_RSI + 2);
  std::__cxx11::stringbuf::str();
  __s = *(char **)(in_RSI + 4);
  sVar3 = strlen(__s);
  while ((0x2e < (byte)__s[sVar3] - 0x2f ||
         ((0x600000000801U >> ((ulong)((byte)__s[sVar3] - 0x2f) & 0x3f) & 1) == 0))) {
    if (sVar3 == 0) goto LAB_0016a17d;
    sVar3 = sVar3 - 1;
  }
  __s = __s + sVar3 + 1;
LAB_0016a17d:
  ::syslog(__pri,"%s: %s (%s:%d)",uVar2,local_48,__s,(ulong)(uint)in_RSI[6]);
  dVar4 = extraout_XMM0_Qa;
  if (local_48 != local_38) {
    operator_delete(local_48);
    dVar4 = extraout_XMM0_Qa_00;
  }
  return dVar4;
}

Assistant:

void syslog::log(message const &msg)
		{
			int syslevel;
			level_type l=msg.level();
			if(/*emergency <= l &&*/ l < alert)
				syslevel = LOG_EMERG;
			else if(alert <= l && l < critical)
				syslevel = LOG_ALERT;
			else if(critical <= l && l < error)
				syslevel = LOG_CRIT;
			else if(error <= l && l < warning)
				syslevel=LOG_ERR;
			else if(warning <= l && l < notice)
				syslevel = LOG_WARNING;
			else if(notice <= l && l< info)
				syslevel = LOG_NOTICE;
			else if(info <= l && l<debug)
				syslevel = LOG_INFO;
			else /*if(debug <= l)*/
				syslevel = LOG_DEBUG;
			::syslog(syslevel,"%s: %s (%s:%d)",msg.module(),msg.log_message().c_str(),msg.file_name(),msg.file_line());
		}